

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

void __thiscall Assimp::STEP::LazyObject::~LazyObject(LazyObject *this)

{
  if (this->obj != (Object *)0x0) {
    (*this->obj->_vptr_Object[1])();
    return;
  }
  if (this->args == (char *)0x0) {
    return;
  }
  operator_delete__(this->args);
  return;
}

Assistant:

STEP::LazyObject::~LazyObject() {
    // make sure the right dtor/operator delete get called
    if (obj) {
        delete obj;
    } else {
        delete[] args;
    }
}